

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::testGroupEnded
          (RunContext *this,string *testSpec,Totals *totals,size_t groupIndex,size_t groupsCount)

{
  size_t _totals;
  bool _aborting;
  pointer pIVar1;
  GroupInfo local_d8;
  TestGroupStats local_a8;
  size_t local_30;
  size_t groupsCount_local;
  size_t groupIndex_local;
  Totals *totals_local;
  string *testSpec_local;
  RunContext *this_local;
  
  local_30 = groupsCount;
  groupsCount_local = groupIndex;
  groupIndex_local = (size_t)totals;
  totals_local = (Totals *)testSpec;
  testSpec_local = (string *)this;
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  GroupInfo::GroupInfo(&local_d8,(string *)totals_local,groupsCount_local,local_30);
  _totals = groupIndex_local;
  _aborting = aborting(this);
  TestGroupStats::TestGroupStats(&local_a8,&local_d8,(Totals *)_totals,_aborting);
  (*pIVar1->_vptr_IStreamingReporter[0xd])(pIVar1,&local_a8);
  TestGroupStats::~TestGroupStats(&local_a8);
  GroupInfo::~GroupInfo(&local_d8);
  return;
}

Assistant:

void RunContext::testGroupEnded(std::string const& testSpec, Totals const& totals, std::size_t groupIndex, std::size_t groupsCount) {
        m_reporter->testGroupEnded(TestGroupStats(GroupInfo(testSpec, groupIndex, groupsCount), totals, aborting()));
    }